

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrismaticJoint.cpp
# Opt level: O0

void __thiscall
iDynTree::PrismaticJoint::computeChildVel
          (PrismaticJoint *this,VectorDynSize *jntPos,VectorDynSize *jntVel,LinkVelArray *linkVels,
          LinkIndex child,LinkIndex parent)

{
  ulong uVar1;
  Twist *pTVar2;
  VectorDynSize *in_RDX;
  undefined8 in_RSI;
  LinkVelArray *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  SpatialMotionVector vj;
  SpatialMotionVector S;
  Transform *child_X_parent;
  double ddist;
  Twist local_130 [48];
  Transform local_100 [48];
  Twist local_d0 [48];
  SpatialMotionVector local_a0;
  undefined1 local_70 [48];
  Twist *local_40;
  double local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_10 = in_RSI;
  uVar1 = (**(code **)((in_RDI->m_linkTwist).
                       super__Vector_base<iDynTree::Twist,_std::allocator<iDynTree::Twist>_>._M_impl
                       .super__Vector_impl_data._M_start + 0xc0))();
  local_38 = (double)iDynTree::VectorDynSize::operator()(in_RDX,uVar1);
  local_40 = (Twist *)(**(code **)((in_RDI->m_linkTwist).
                                   super__Vector_base<iDynTree::Twist,_std::allocator<iDynTree::Twist>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 0x50))
                                (in_RDI,local_10,local_28,local_30);
  (**(code **)((in_RDI->m_linkTwist).
               super__Vector_base<iDynTree::Twist,_std::allocator<iDynTree::Twist>_>._M_impl.
               super__Vector_impl_data._M_start + 0x60))
            (local_70,in_RDI,0,local_28,LINK_INVALID_INDEX);
  iDynTree::SpatialMotionVector::operator*(&local_a0,local_38);
  pTVar2 = local_40;
  LinkVelArray::operator()(in_RDI,(LinkIndex)in_RDX);
  iDynTree::Transform::operator*(local_100,pTVar2);
  iDynTree::Twist::Twist(local_130,&local_a0);
  iDynTree::Twist::operator+(local_d0,(Twist *)local_100);
  pTVar2 = LinkVelArray::operator()(in_RDI,(LinkIndex)in_RDX);
  iDynTree::Twist::operator=(pTVar2,local_d0);
  return;
}

Assistant:

void PrismaticJoint::computeChildVel(const VectorDynSize & jntPos,
                                    const VectorDynSize & jntVel,
                                          LinkVelArray & linkVels,
                                    const LinkIndex child, const LinkIndex parent) const
{
    double ddist = jntVel(this->getDOFsOffset());

    const Transform & child_X_parent = this->getTransform(jntPos,child,parent);

    // Propagate twist and spatial acceleration: for a prismatic joint (as for any 1 dof joint)
    // we implement equation 5.14 and 5.15 of Feathestone RBDA, 2008
    iDynTree::SpatialMotionVector S = this->getMotionSubspaceVector(0,child);

    SpatialMotionVector vj = S*ddist;
    linkVels(child) = child_X_parent*linkVels(parent) + vj;

    return;
}